

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::Prime(HeapInfo *this)

{
  IdleDecommitPageAllocator::Prime
            (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator,0x1000);
  IdleDecommitPageAllocator::Prime
            (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator,0x1000);
  IdleDecommitPageAllocator::Prime
            (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator,0x1000);
  IdleDecommitPageAllocator::Prime(this->recyclerLeafPageAllocator,0x1000);
  return;
}

Assistant:

void
HeapInfo::Prime()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->Prime(RecyclerPageAllocator::DefaultPrimePageCount);
    });
}